

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::
SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>>
::emplace_back<int,int>
          (SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>>
           *this,int *args,int *args_1)

{
  ulong uVar1;
  undefined1 *puVar2;
  reference ppVar3;
  reference extraout_RAX;
  EVP_PKEY_CTX *pEVar4;
  EVP_PKEY_CTX *pEVar5;
  uint uVar6;
  EVP_PKEY_CTX *ctx;
  int iVar7;
  undefined4 *puVar8;
  undefined1 *puVar9;
  ulong uVar10;
  long lVar11;
  
  uVar1 = *(ulong *)(this + 8);
  lVar11 = uVar1 * 0x10;
  pEVar5 = (EVP_PKEY_CTX *)(*(long *)this + lVar11);
  if (uVar1 == *(ulong *)(this + 0x10)) {
    if (uVar1 == 0x7ffffffffffffff) {
      detail::throwLengthError();
    }
    uVar10 = uVar1 + 1;
    if (uVar1 + 1 < uVar1 * 2) {
      uVar10 = uVar1 * 2;
    }
    if (0x7ffffffffffffff - uVar1 < uVar1) {
      uVar10 = 0x7ffffffffffffff;
    }
    puVar2 = (undefined1 *)operator_new(uVar10 << 4);
    iVar7 = *args;
    puVar2[lVar11] = 1;
    *(int *)(puVar2 + lVar11 + 4) = iVar7;
    iVar7 = *args_1;
    puVar2[lVar11 + 8] = 1;
    *(int *)(puVar2 + lVar11 + 0xc) = iVar7;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 2;
    ctx = *(EVP_PKEY_CTX **)this;
    pEVar4 = ctx + *(long *)(this + 8) * 0x10;
    if (pEVar4 == pEVar5) {
      if (*(long *)(this + 8) != 0) {
        iVar7 = 0;
        puVar9 = puVar2;
        do {
          *puVar9 = 1;
          *(undefined4 *)(puVar9 + 4) = *(undefined4 *)(ctx + 4);
          *(undefined4 *)(ctx + 4) = 0;
          puVar9[8] = 1;
          *(undefined4 *)(puVar9 + 0xc) = *(undefined4 *)(ctx + 0xc);
          *(undefined4 *)(ctx + 0xc) = 0;
          ctx = ctx + 0x10;
          puVar9 = puVar9 + 0x10;
          iVar7 = iVar7 + -2;
        } while (ctx != pEVar5);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar7;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar7;
      }
    }
    else {
      if (ctx != pEVar5) {
        iVar7 = 0;
        puVar9 = puVar2;
        do {
          *puVar9 = 1;
          *(undefined4 *)(puVar9 + 4) = *(undefined4 *)(ctx + 4);
          *(undefined4 *)(ctx + 4) = 0;
          puVar9[8] = 1;
          *(undefined4 *)(puVar9 + 0xc) = *(undefined4 *)(ctx + 0xc);
          *(undefined4 *)(ctx + 0xc) = 0;
          ctx = ctx + 0x10;
          puVar9 = puVar9 + 0x10;
          iVar7 = iVar7 + -2;
        } while (ctx != pEVar5);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar7;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar7;
      }
      puVar8 = (undefined4 *)(puVar2 + lVar11 + 0x1c);
      ctx = (EVP_PKEY_CTX *)0x0;
      do {
        *(undefined1 *)(puVar8 + -3) = 1;
        puVar8[-2] = *(undefined4 *)(pEVar5 + 4);
        *(undefined4 *)(pEVar5 + 4) = 0;
        *(undefined1 *)(puVar8 + -1) = 1;
        *puVar8 = *(undefined4 *)(pEVar5 + 0xc);
        *(undefined4 *)(pEVar5 + 0xc) = 0;
        pEVar5 = pEVar5 + 0x10;
        puVar8 = puVar8 + 4;
        uVar6 = (int)ctx - 2;
        ctx = (EVP_PKEY_CTX *)(ulong)uVar6;
      } while (pEVar5 != pEVar4);
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls - uVar6;
      (anonymous_namespace)::Constructable::numMoveConstructorCalls =
           (anonymous_namespace)::Constructable::numMoveConstructorCalls - uVar6;
    }
    SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
    ::cleanup((SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
               *)this,ctx);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar10;
    *(undefined1 **)this = puVar2;
    ppVar3 = extraout_RAX;
  }
  else {
    iVar7 = *args;
    *pEVar5 = (EVP_PKEY_CTX)0x1;
    *(int *)(pEVar5 + 4) = iVar7;
    iVar7 = *args_1;
    pEVar5[8] = (EVP_PKEY_CTX)0x1;
    *(int *)(pEVar5 + 0xc) = iVar7;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 2;
    ppVar3 = (reference)(uVar1 + 1);
    *(reference *)(this + 8) = ppVar3;
  }
  return ppVar3;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }